

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QDBusSlotCache::Key,QDBusSlotCache::Data>::
emplaceValue<QDBusSlotCache::Data_const&>
          (Node<QDBusSlotCache::Key,QDBusSlotCache::Data> *this,Data *args)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QMetaType> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = args->slotIdx;
  local_20.d = (args->metaTypes).d.d;
  local_20.ptr = (args->metaTypes).d.ptr;
  local_20.size = (args->metaTypes).d.size;
  if (&(local_20.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_20.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_20.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(int *)(this + 0x20) = iVar1;
  QArrayDataPointer<QMetaType>::operator=((QArrayDataPointer<QMetaType> *)(this + 0x28),&local_20);
  if (&(local_20.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }